

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi_test.c
# Opt level: O2

void class_test(char *filename,FILE *fp)

{
  uint uVar1;
  byte bVar2;
  _Bool _Var3;
  int iVar4;
  size_t i;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  uint *order;
  ulong uVar8;
  uint *puVar9;
  uint uc;
  wchar_t ch;
  uint lineno;
  size_t oldlen;
  bidi_char *local_e0;
  size_t local_d8;
  char *p;
  ulong local_c0;
  FILE *local_b8;
  char *local_b0;
  size_t order_size;
  size_t bcs_size;
  uint representatives [23];
  
  bcs_size = 0;
  order_size = 0;
  for (lVar5 = 0; lVar5 != 0x17; lVar5 = lVar5 + 1) {
    representatives[lVar5] = 0;
  }
  for (ch = L'\x01'; ch != L'\x00110000'; ch = ch + L'\x01') {
    bVar2 = bidi_getType(ch);
    if (representatives[bVar2] == 0) {
LAB_001014f4:
      representatives[bVar2] = ch;
    }
    else {
      iVar4 = mk_wcwidth(representatives[bVar2]);
      if (iVar4 < 1) {
        iVar4 = mk_wcwidth(ch);
        if (0 < iVar4) goto LAB_001014f4;
      }
    }
  }
  order = (uint *)0x0;
  oldlen = 0;
  local_e0 = (bidi_char *)0x0;
  lineno = 0;
  do {
    while( true ) {
      lineno = lineno + 1;
      pcVar6 = fgetline(fp);
      pcVar6 = chomp(pcVar6);
      if (pcVar6 == (char *)0x0) {
        safefree(local_e0);
        safefree(order);
        return;
      }
      if ((*pcVar6 != '#') && (*pcVar6 != '\0')) break;
LAB_0010158b:
      safefree(pcVar6);
    }
    _Var3 = strstartswith(pcVar6,"@Reorder:");
    if (!_Var3) {
      _Var3 = strstartswith(pcVar6,"@Levels:");
      if (!_Var3) {
        pcVar7 = strchr(pcVar6,0x3b);
        if (pcVar7 == (char *)0x0) {
          printf("%s:%u: bad test line\': no bitmap\n",filename,(ulong)lineno);
        }
        else {
          *pcVar7 = '\0';
          local_c0 = strtoul(pcVar7 + 1,(char **)0x0,0);
          local_d8 = 0;
          p = pcVar6;
          local_b8 = fp;
          while( true ) {
            fp = local_b8;
            local_b0 = extract_word(&p);
            if (*local_b0 == '\0') break;
            lVar5 = 0;
            puVar9 = representatives;
            while( true ) {
              if (lVar5 == 0xb8) {
                printf("%s:%u: bad test line: bad bidi type \'%s\'\n",filename,(ulong)lineno,
                       local_b0);
                fp = local_b8;
                goto LAB_0010158b;
              }
              iVar4 = strcmp(local_b0,*(char **)((long)typenames + lVar5));
              if (iVar4 == 0) break;
              puVar9 = puVar9 + 1;
              lVar5 = lVar5 + 8;
            }
            local_e0 = (bidi_char *)safegrowarray(local_e0,&bcs_size,0xc,local_d8,1,false);
            uVar1 = *puVar9;
            local_e0[local_d8].wc = uVar1;
            local_e0[local_d8].origwc = uVar1;
            local_e0[local_d8].index = (unsigned_short)local_d8;
            local_e0[local_d8].nchars = 1;
            local_d8 = local_d8 + 1;
          }
          if ((local_c0 & 1) != 0) {
            run_test(filename,lineno,local_e0,local_d8,order,oldlen,0);
          }
          if ((local_c0 & 2) != 0) {
            run_test(filename,lineno,local_e0,local_d8,order,oldlen,1);
          }
          if ((local_c0 & 4) != 0) {
            run_test(filename,lineno,local_e0,local_d8,order,oldlen,-1);
          }
        }
      }
      goto LAB_0010158b;
    }
    p = pcVar6;
    extract_word(&p);
    oldlen = 0;
    while( true ) {
      pcVar7 = extract_word(&p);
      if (*pcVar7 == '\0') break;
      order = (uint *)safegrowarray(order,&order_size,4,oldlen,1,false);
      uVar8 = strtoul(pcVar7,(char **)0x0,0);
      order[oldlen] = (uint)uVar8;
      oldlen = oldlen + 1;
    }
    safefree(pcVar6);
  } while( true );
}

Assistant:

static void class_test(const char *filename, FILE *fp)
{
    unsigned lineno = 0;
    size_t bcs_size = 0, bcs_len = 0;
    bidi_char *bcs = NULL;
    size_t order_size = 0, order_len = 0;
    unsigned *order = NULL;

    /* Preliminary: find a representative character of every bidi
     * type. Prefer positive-width ones if available. */
    unsigned representatives[N_BIDI_TYPES];
    for (size_t i = 0; i < N_BIDI_TYPES; i++)
        representatives[i] = 0;
    for (unsigned uc = 1; uc < 0x110000; uc++) {
        unsigned type = bidi_getType(uc);
        if (!representatives[type] ||
            (mk_wcwidth(representatives[type]) <= 0 && mk_wcwidth(uc) > 0))
            representatives[type] = uc;
    }

    while (true) {
        lineno++;
        char *line = chomp(fgetline(fp));
        if (!line)
            break;

        /* Skip blank lines and comments */
        if (!line[0] || line[0] == '#') {
            sfree(line);
            continue;
        }

        /* Parse @Reorder lines, which tell us the expected output
         * order for all following test cases (until superseded) */
        if (strstartswith(line, "@Reorder:")) {
            char *p = line;
            extract_word(&p); /* eat the "@Reorder:" header itself */
            order_len = 0;
            while (1) {
                const char *word = extract_word(&p);
                if (!*word)
                    break;
                sgrowarray(order, order_size, order_len);
                order[order_len++] = strtoul(word, NULL, 0);
            }

            sfree(line);
            continue;
        }

        /* Skip @Levels lines, which we don't (yet?) do anything with */
        if (strstartswith(line, "@Levels:")) {
            sfree(line);
            continue;
        }

        /* Everything remaining should be an actual test */
        char *semicolon = strchr(line, ';');
        if (!semicolon) {
            printf("%s:%u: bad test line': no bitmap\n", filename, lineno);
            sfree(line);
            continue;
        }
        *semicolon++ = '\0';
        unsigned bitmask = strtoul(semicolon, NULL, 0);
        char *p = line;
        bcs_len = 0;
        bool test_ok = true;
        while (1) {
            const char *word = extract_word(&p);
            if (!*word)
                break;
            unsigned type;
            for (type = 0; type < N_BIDI_TYPES; type++)
                if (!strcmp(word, typenames[type]))
                    break;
            if (type == N_BIDI_TYPES) {
                printf("%s:%u: bad test line: bad bidi type '%s'\n",
                       filename, lineno, word);
                test_ok = false;
                break;
            }
            sgrowarray(bcs, bcs_size, bcs_len);
            bcs[bcs_len].wc = representatives[type];
            bcs[bcs_len].origwc = bcs[bcs_len].wc;
            bcs[bcs_len].index = bcs_len;
            bcs[bcs_len].nchars = 1;
            bcs_len++;
        }

        if (!test_ok) {
            sfree(line);
            continue;
        }

        if (bitmask & 1)
            run_test(filename, lineno, bcs, bcs_len, order, order_len, 0);
        if (bitmask & 2)
            run_test(filename, lineno, bcs, bcs_len, order, order_len, +1);
        if (bitmask & 4)
            run_test(filename, lineno, bcs, bcs_len, order, order_len, -1);

        sfree(line);
    }

    sfree(bcs);
    sfree(order);
}